

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.h
# Opt level: O0

void __thiscall
soplex::SPxSteepPR<double>::SPxSteepPR(SPxSteepPR<double> *this,SPxSteepPR<double> *old)

{
  undefined8 uVar1;
  long in_RSI;
  SSVectorBase<double> *in_RDI;
  undefined8 in_stack_ffffffffffffffb8;
  bool *pbVar2;
  SSVectorBase<double> *in_stack_ffffffffffffffc8;
  int n;
  
  SPxPricer<double>::SPxPricer
            ((SPxPricer<double> *)in_RDI,(SPxPricer<double> *)in_stack_ffffffffffffffc8);
  (in_RDI->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR_getName_00898c20;
  SSVectorBase<double>::SSVectorBase(in_RDI,in_stack_ffffffffffffffc8);
  pbVar2 = &in_RDI[1].setupStatus;
  SSVectorBase<double>::SSVectorBase(in_RDI,(SSVectorBase<double> *)pbVar2);
  n = (int)((ulong)pbVar2 >> 0x20);
  pbVar2 = &in_RDI[2].setupStatus;
  Array<soplex::SPxPricer<double>::IdxElement>::Array
            ((Array<soplex::SPxPricer<double>::IdxElement> *)pbVar2,
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  Array<soplex::SPxPricer<double>::IdxElement>::Array
            ((Array<soplex::SPxPricer<double>::IdxElement> *)pbVar2,
             (int)((ulong)(in_RDI + 3) >> 0x20));
  DIdxSet::DIdxSet((DIdxSet *)in_RDI,n);
  DIdxSet::DIdxSet((DIdxSet *)in_RDI,n);
  uVar1 = *(undefined8 *)(in_RSI + 0x148);
  in_RDI[4].super_IdxSet.num = (int)uVar1;
  in_RDI[4].super_IdxSet.len = (int)((ulong)uVar1 >> 0x20);
  *(undefined4 *)&in_RDI[4].super_IdxSet.idx = *(undefined4 *)(in_RSI + 0x150);
  *(byte *)((long)&in_RDI[4].super_IdxSet.idx + 4) = *(byte *)(in_RSI + 0x154) & 1;
  return;
}

Assistant:

SPxSteepPR(const SPxSteepPR& old)
      : SPxPricer<R>(old)
      , workVec(old.workVec)
      , workRhs(old.workRhs)
      , pi_p(old.pi_p)
      , setup(old.setup)
      , refined(old.refined)
   {
      assert(isConsistent());
   }